

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O3

int skip_map_or_array(MMDB_s *mmdb,MMDB_entry_data_s *entry_data)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 0;
  if (entry_data->type == 0xb) {
    iVar2 = entry_data->data_size + 1;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        return 0;
      }
      iVar1 = decode_one((MMDB_s *)mmdb->data_section,mmdb->data_section_size,
                         (MMDB_entry_data_s *)(ulong)entry_data->offset_to_next);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = skip_map_or_array(mmdb,entry_data);
    } while (iVar1 == 0);
  }
  else if (entry_data->type == 7) {
    iVar2 = entry_data->data_size + 1;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        return 0;
      }
      iVar1 = decode_one((MMDB_s *)mmdb->data_section,mmdb->data_section_size,
                         (MMDB_entry_data_s *)(ulong)entry_data->offset_to_next);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = decode_one((MMDB_s *)mmdb->data_section,mmdb->data_section_size,
                         (MMDB_entry_data_s *)(ulong)entry_data->offset_to_next);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = skip_map_or_array(mmdb,entry_data);
    } while (iVar1 == 0);
  }
  return iVar1;
}

Assistant:

static int skip_map_or_array(const MMDB_s *const mmdb,
                             MMDB_entry_data_s *entry_data) {
    if (entry_data->type == MMDB_DATA_TYPE_MAP) {
        uint32_t size = entry_data->data_size;
        while (size-- > 0) {
            CHECKED_DECODE_ONE(
                mmdb, entry_data->offset_to_next, entry_data); // key
            CHECKED_DECODE_ONE(
                mmdb, entry_data->offset_to_next, entry_data); // value
            int status = skip_map_or_array(mmdb, entry_data);
            if (MMDB_SUCCESS != status) {
                return status;
            }
        }
    } else if (entry_data->type == MMDB_DATA_TYPE_ARRAY) {
        uint32_t size = entry_data->data_size;
        while (size-- > 0) {
            CHECKED_DECODE_ONE(
                mmdb, entry_data->offset_to_next, entry_data); // value
            int status = skip_map_or_array(mmdb, entry_data);
            if (MMDB_SUCCESS != status) {
                return status;
            }
        }
    }

    return MMDB_SUCCESS;
}